

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::alphaProductPlusY
          (HighsSparseMatrix *this,double alpha,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,bool transpose)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  byte in_CL;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  HighsSparseMatrix *in_RDI;
  double in_XMM0_Qa;
  int iEl_3;
  int iRow_1;
  int iEl_2;
  int iRow;
  int iEl_1;
  int iCol_1;
  int iEl;
  int iCol;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  
  bVar3 = isColwise(in_RDI);
  if (bVar3) {
    if ((in_CL & 1) == 0) {
      for (local_30 = 0; local_30 < in_RDI->num_col_; local_30 = local_30 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_30);
        for (local_34 = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)(local_30 + 1)), local_34 < *pvVar4;
            local_34 = local_34 + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)local_34);
          dVar1 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_30);
          dVar2 = *pvVar5;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->index_,(long)local_34);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)*pvVar4);
          *pvVar6 = in_XMM0_Qa * dVar1 * dVar2 + *pvVar6;
        }
      }
    }
    else {
      for (local_28 = 0; local_28 < in_RDI->num_col_; local_28 = local_28 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_28);
        for (local_2c = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)(local_28 + 1)), local_2c < *pvVar4;
            local_2c = local_2c + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)local_2c);
          dVar1 = *pvVar5;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->index_,(long)local_2c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar4);
          dVar2 = *pvVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_28);
          *pvVar6 = in_XMM0_Qa * dVar1 * dVar2 + *pvVar6;
        }
      }
    }
  }
  else if ((in_CL & 1) == 0) {
    for (local_40 = 0; local_40 < in_RDI->num_row_; local_40 = local_40 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_40);
      for (local_44 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_40 + 1)), local_44 < *pvVar4;
          local_44 = local_44 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_44);
        dVar1 = *pvVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_44);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar4);
        dVar2 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_40);
        *pvVar6 = in_XMM0_Qa * dVar1 * dVar2 + *pvVar6;
      }
    }
  }
  else {
    for (local_38 = 0; local_38 < in_RDI->num_row_; local_38 = local_38 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_38);
      for (local_3c = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_38 + 1)), local_3c < *pvVar4;
          local_3c = local_3c + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_3c);
        dVar1 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_38);
        dVar2 = *pvVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_3c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)*pvVar4);
        *pvVar6 = in_XMM0_Qa * dVar1 * dVar2 + *pvVar6;
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::alphaProductPlusY(const double alpha,
                                          const std::vector<double>& x,
                                          std::vector<double>& y,
                                          const bool transpose) const {
  assert(x.size() >= static_cast<size_t>(transpose) ? this->num_row_
                                                    : this->num_col_);
  assert(y.size() >= static_cast<size_t>(transpose) ? this->num_col_
                                                    : this->num_row_);
  if (this->isColwise()) {
    if (transpose) {
      for (int iCol = 0; iCol < this->num_col_; iCol++)
        for (int iEl = this->start_[iCol]; iEl < this->start_[iCol + 1]; iEl++)
          y[iCol] += alpha * this->value_[iEl] * x[this->index_[iEl]];
    } else {
      for (int iCol = 0; iCol < this->num_col_; iCol++)
        for (int iEl = this->start_[iCol]; iEl < this->start_[iCol + 1]; iEl++)
          y[this->index_[iEl]] += alpha * this->value_[iEl] * x[iCol];
    }
  } else {
    if (transpose) {
      for (int iRow = 0; iRow < this->num_row_; iRow++)
        for (int iEl = this->start_[iRow]; iEl < this->start_[iRow + 1]; iEl++)
          y[this->index_[iEl]] += alpha * this->value_[iEl] * x[iRow];
    } else {
      for (int iRow = 0; iRow < this->num_row_; iRow++)
        for (int iEl = this->start_[iRow]; iEl < this->start_[iRow + 1]; iEl++)
          y[iRow] += alpha * this->value_[iEl] * x[this->index_[iEl]];
    }
  }
}